

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptLiteral(HlslGrammar *this,TIntermTyped **node)

{
  HlslToken *loc;
  EHlslTokenClass EVar1;
  TIntermConstantUnion *pTVar2;
  TBasicType baseType;
  TIntermediate *this_00;
  double d;
  
  EVar1 = (this->super_HlslTokenStream).token.tokenClass;
  if (6 < EVar1 - EHTokFloat16Constant) {
    return false;
  }
  loc = &(this->super_HlslTokenStream).token;
  switch(EVar1) {
  case EHTokFloat16Constant:
    this_00 = this->intermediate;
    d = (this->super_HlslTokenStream).token.field_2.d;
    baseType = EbtFloat16;
    goto LAB_003a256f;
  case EHTokFloatConstant:
    this_00 = this->intermediate;
    d = (this->super_HlslTokenStream).token.field_2.d;
    baseType = EbtFloat;
    goto LAB_003a256f;
  case EHTokDoubleConstant:
    this_00 = this->intermediate;
    d = (this->super_HlslTokenStream).token.field_2.d;
    baseType = EbtDouble;
LAB_003a256f:
    pTVar2 = TIntermediate::addConstantUnion(this_00,d,baseType,&loc->loc,true);
    break;
  case EHTokIntConstant:
    pTVar2 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.i,&loc->loc,
                        true);
    break;
  case EHTokUintConstant:
    pTVar2 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.u,&loc->loc,
                        true);
    break;
  case EHTokBoolConstant:
    pTVar2 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.b,&loc->loc,
                        true);
    break;
  case EHTokStringConstant:
    pTVar2 = TIntermediate::addConstantUnion
                       (this->intermediate,(this->super_HlslTokenStream).token.field_2.string,
                        &loc->loc,true);
  }
  *node = &pTVar2->super_TIntermTyped;
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  return true;
}

Assistant:

bool HlslGrammar::acceptLiteral(TIntermTyped*& node)
{
    switch (token.tokenClass) {
    case EHTokIntConstant:
        node = intermediate.addConstantUnion(token.i, token.loc, true);
        break;
    case EHTokUintConstant:
        node = intermediate.addConstantUnion(token.u, token.loc, true);
        break;
    case EHTokFloat16Constant:
        node = intermediate.addConstantUnion(token.d, EbtFloat16, token.loc, true);
        break;
    case EHTokFloatConstant:
        node = intermediate.addConstantUnion(token.d, EbtFloat, token.loc, true);
        break;
    case EHTokDoubleConstant:
        node = intermediate.addConstantUnion(token.d, EbtDouble, token.loc, true);
        break;
    case EHTokBoolConstant:
        node = intermediate.addConstantUnion(token.b, token.loc, true);
        break;
    case EHTokStringConstant:
        node = intermediate.addConstantUnion(token.string, token.loc, true);
        break;

    default:
        return false;
    }

    advanceToken();

    return true;
}